

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O2

void CP_validateParams(SstStream Stream,SstParams Params,int Writer)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined8 in_RAX;
  size_t sVar6;
  char *pcVar7;
  __int32_t **pp_Var8;
  char *pcVar9;
  int i;
  long lVar10;
  undefined8 uStack_38;
  int tmp;
  
  uVar3 = Params->RendezvousReaderCount;
  uStack_38 = in_RAX;
  if ((int)uVar3 < 0) {
    fprintf(_stderr,"Invalid RendezvousReaderCount parameter value (%d) for SST Stream %s\n",
            (ulong)uVar3,Stream->Filename);
  }
  else {
    Stream->RendezvousReaderCount = uVar3;
  }
  uVar3 = Params->QueueLimit;
  if ((int)uVar3 < 0) {
    fprintf(_stderr,"Invalid QueueLimit parameter value (%d) for SST Stream %s\n",(ulong)uVar3,
            Stream->Filename);
  }
  else {
    Stream->QueueLimit = uVar3;
  }
  Stream->QueueFullPolicy = (SstQueueFullPolicy)Params->QueueFullPolicy;
  Stream->RegistrationMethod = (SstRegistrationMethod)Params->RegistrationMethod;
  pcVar9 = Params->DataTransport;
  if (pcVar9 != (char *)0x0) {
    sVar6 = strlen(pcVar9);
    pcVar7 = (char *)malloc(sVar6 + 1);
    for (lVar10 = 0; cVar2 = pcVar9[lVar10], (long)cVar2 != 0; lVar10 = lVar10 + 1) {
      pp_Var8 = __ctype_tolower_loc();
      pcVar7[lVar10] = (char)(*pp_Var8)[cVar2];
    }
    pcVar7[lVar10] = '\0';
    free(pcVar9);
    iVar5 = strcmp(pcVar7,"wan");
    if ((iVar5 == 0) || (iVar5 = strcmp(pcVar7,"evpath"), iVar5 == 0)) {
      pcVar9 = "evpath";
    }
    else {
      iVar5 = strcmp(pcVar7,"rdma");
      if ((iVar5 == 0) ||
         ((((*pcVar7 == 'i' && (pcVar7[1] == 'b')) && (pcVar7[2] == '\0')) ||
          (iVar5 = strcmp(pcVar7,"fabric"), iVar5 == 0)))) {
        pcVar9 = "rdma";
      }
      else {
        iVar5 = strcmp(pcVar7,"ucx");
        pcVar9 = pcVar7;
        if (iVar5 == 0) {
          pcVar9 = "ucx";
        }
      }
    }
    pcVar9 = strdup(pcVar9);
    Params->DataTransport = pcVar9;
    free(pcVar7);
  }
  pcVar9 = Params->ControlTransport;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = strdup("sockets");
    Params->ControlTransport = pcVar9;
  }
  else {
    sVar6 = strlen(pcVar9);
    pcVar7 = (char *)malloc(sVar6 + 1);
    for (lVar10 = 0; cVar2 = pcVar9[lVar10], (long)cVar2 != 0; lVar10 = lVar10 + 1) {
      pp_Var8 = __ctype_tolower_loc();
      pcVar7[lVar10] = (char)(*pp_Var8)[cVar2];
    }
    pcVar7[lVar10] = '\0';
    iVar5 = strcmp(pcVar7,"sockets");
    if ((iVar5 == 0) || (iVar5 = strcmp(pcVar7,"tcp"), iVar5 == 0)) {
      pcVar9 = "sockets";
LAB_001164ec:
      pcVar9 = strdup(pcVar9);
      Params->ControlTransport = pcVar9;
    }
    else {
      iVar5 = strcmp(pcVar7,"udp");
      if (((iVar5 == 0) || (iVar5 = strcmp(pcVar7,"rudp"), iVar5 == 0)) ||
         ((iVar5 = strcmp(pcVar7,"scalable"), iVar5 == 0 ||
          (iVar5 = strcmp(pcVar7,"enet"), iVar5 == 0)))) {
        pcVar9 = "enet";
        goto LAB_001164ec;
      }
    }
    free(pcVar7);
  }
  piVar1 = &Stream->ConnectionUsleepMultiplier;
  Stream->ConnectionUsleepMultiplier = 0x32;
  iVar5 = strcmp(pcVar9,"enet");
  if ((iVar5 == 0) && (pcVar9 = getenv("USLEEP_MULTIPLIER"), pcVar9 != (char *)0x0)) {
    __isoc99_sscanf("%d",pcVar9,piVar1);
  }
  lVar10 = 0;
  while( true ) {
    pcVar9 = Params->ControlTransport;
    cVar2 = pcVar9[lVar10];
    if ((long)cVar2 == 0) break;
    pp_Var8 = __ctype_tolower_loc();
    pcVar9[lVar10] = (char)(*pp_Var8)[cVar2];
    lVar10 = lVar10 + 1;
  }
  iVar5 = strcmp(pcVar9,"enet");
  if ((iVar5 == 0) && (pcVar7 = getenv("USLEEP_MULTIPLIER"), pcVar7 != (char *)0x0)) {
    iVar5 = __isoc99_sscanf(pcVar7,"%d",&tmp);
    if (iVar5 == 1) {
      *piVar1 = tmp;
    }
    else {
      tmp = *piVar1;
    }
    CP_verbose(Stream,PerStepVerbose,"USING %d as usleep multiplier before connections\n",
               (ulong)(uint)tmp);
    pcVar9 = Params->ControlTransport;
  }
  CP_verbose(Stream,PerStepVerbose,"Sst set to use %s as a Control Transport\n",pcVar9);
  pcVar9 = Params->ControlModule;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = strdup("select");
    Params->ControlModule = pcVar9;
    goto LAB_001166a9;
  }
  sVar6 = strlen(pcVar9);
  pcVar7 = (char *)malloc(sVar6 + 1);
  for (lVar10 = 0; cVar2 = pcVar9[lVar10], (long)cVar2 != 0; lVar10 = lVar10 + 1) {
    pp_Var8 = __ctype_tolower_loc();
    pcVar7[lVar10] = (char)(*pp_Var8)[cVar2];
  }
  pcVar7[lVar10] = '\0';
  iVar5 = strcmp(pcVar7,"select");
  if (iVar5 == 0) {
    pcVar9 = "select";
LAB_00116695:
    pcVar9 = strdup(pcVar9);
    Params->ControlModule = pcVar9;
  }
  else {
    iVar5 = strcmp(pcVar7,"epoll");
    if (iVar5 == 0) {
      pcVar9 = "epoll";
      goto LAB_00116695;
    }
    fprintf(_stderr,"Invalid ControlModule parameter (%s) for SST Stream %s\n",pcVar9,
            Stream->Filename);
  }
  free(pcVar7);
LAB_001166a9:
  iVar5 = Params->verbose;
  iVar4 = Stream->CPVerbosityLevel;
  if (iVar4 < iVar5) {
    Stream->CPVerbosityLevel = iVar5;
  }
  else if (iVar5 < iVar4) {
    Params->verbose = iVar4;
  }
  return;
}

Assistant:

void CP_validateParams(SstStream Stream, SstParams Params, int Writer)
{
    if (Params->RendezvousReaderCount >= 0)
    {
        Stream->RendezvousReaderCount = Params->RendezvousReaderCount;
    }
    else
    {
        fprintf(stderr,
                "Invalid RendezvousReaderCount parameter value (%d) "
                "for SST Stream %s\n",
                Params->RendezvousReaderCount, Stream->Filename);
    }
    if (Params->QueueLimit >= 0)
    {
        Stream->QueueLimit = Params->QueueLimit;
    }
    else
    {
        fprintf(stderr, "Invalid QueueLimit parameter value (%d) for SST Stream %s\n",
                Params->QueueLimit, Stream->Filename);
    }
    Stream->QueueFullPolicy = (SstQueueFullPolicy)Params->QueueFullPolicy;
    Stream->RegistrationMethod = (SstRegistrationMethod)Params->RegistrationMethod;
    if (Params->DataTransport != NULL)
    {
        int i;
        char *SelectedTransport = malloc(strlen(Params->DataTransport) + 1);
        for (i = 0; Params->DataTransport[i] != 0; i++)
        {
            SelectedTransport[i] = tolower(Params->DataTransport[i]);
        }
        SelectedTransport[i] = 0;
        /* free old */
        free(Params->DataTransport);

        /* canonicalize SelectedTransport */
        if ((strcmp(SelectedTransport, "wan") == 0) || (strcmp(SelectedTransport, "evpath") == 0))
        {
            Params->DataTransport = strdup("evpath");
        }
        else if ((strcmp(SelectedTransport, "rdma") == 0) ||
                 (strcmp(SelectedTransport, "ib") == 0) ||
                 (strcmp(SelectedTransport, "fabric") == 0))
        {
            Params->DataTransport = strdup("rdma");
        }
        else if (strcmp(SelectedTransport, "ucx") == 0)
        {
            Params->DataTransport = strdup("ucx");
        }
        else
        {
            Params->DataTransport = strdup(SelectedTransport);
        }
        free(SelectedTransport);
    }
    if (Params->ControlTransport == NULL)
    {
        /* determine reasonable default, now "sockets" */
        Params->ControlTransport = strdup("sockets");
    }
    else
    {
        int i;
        char *SelectedTransport = malloc(strlen(Params->ControlTransport) + 1);
        for (i = 0; Params->ControlTransport[i] != 0; i++)
        {
            SelectedTransport[i] = tolower(Params->ControlTransport[i]);
        }
        SelectedTransport[i] = 0;

        /* canonicalize SelectedTransport */
        if ((strcmp(SelectedTransport, "sockets") == 0) || (strcmp(SelectedTransport, "tcp") == 0))
        {
            Params->ControlTransport = strdup("sockets");
        }
        else if ((strcmp(SelectedTransport, "udp") == 0) ||
                 (strcmp(SelectedTransport, "rudp") == 0) ||
                 (strcmp(SelectedTransport, "scalable") == 0) ||
                 (strcmp(SelectedTransport, "enet") == 0))
        {
            Params->ControlTransport = strdup("enet");
        }
        free(SelectedTransport);
    }
    Stream->ConnectionUsleepMultiplier = 50;
    if ((strcmp(Params->ControlTransport, "enet") == 0) && getenv("USLEEP_MULTIPLIER"))
    {
        sscanf("%d", getenv("USLEEP_MULTIPLIER"), &Stream->ConnectionUsleepMultiplier);
    }
    for (int i = 0; Params->ControlTransport[i] != 0; i++)
    {
        Params->ControlTransport[i] = tolower(Params->ControlTransport[i]);
    }
    if ((strcmp(Params->ControlTransport, "enet") == 0) && getenv("USLEEP_MULTIPLIER"))
    {
        int tmp;
        if (sscanf(getenv("USLEEP_MULTIPLIER"), "%d", &tmp) == 1)
        {
            Stream->ConnectionUsleepMultiplier = tmp;
        }
        CP_verbose(Stream, PerStepVerbose, "USING %d as usleep multiplier before connections\n",
                   Stream->ConnectionUsleepMultiplier);
    }
    CP_verbose(Stream, PerStepVerbose, "Sst set to use %s as a Control Transport\n",
               Params->ControlTransport);
    if (Params->ControlModule != NULL)
    {
        int i;
        char *SelectedModule = malloc(strlen(Params->ControlModule) + 1);
        for (i = 0; Params->ControlModule[i] != 0; i++)
        {
            SelectedModule[i] = tolower(Params->ControlModule[i]);
        }
        SelectedModule[i] = 0;

        /* canonicalize SelectedModule */
        if (strcmp(SelectedModule, "select") == 0)
        {
            Params->ControlModule = strdup("select");
        }
        else if (strcmp(SelectedModule, "epoll") == 0)
        {
            Params->ControlModule = strdup("epoll");
        }
        else
        {
            fprintf(stderr, "Invalid ControlModule parameter (%s) for SST Stream %s\n",
                    Params->ControlModule, Stream->Filename);
        }
        free(SelectedModule);
    }
    else
    {
        Params->ControlModule = strdup("select");
    }
    if (Params->verbose > Stream->CPVerbosityLevel)
    {
        Stream->CPVerbosityLevel = Params->verbose;
    }
    else if (Params->verbose < Stream->CPVerbosityLevel)
    {
        Params->verbose = Stream->CPVerbosityLevel;
    }
}